

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::grabFocus(WindowImplX11 *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 local_198;
  int result;
  XEvent event;
  XWindowAttributes attr;
  allocator<char> local_39;
  string local_38;
  Atom local_18;
  Atom netActiveWindow;
  WindowImplX11 *this_local;
  
  local_18 = 0;
  netActiveWindow = (Atom)this;
  bVar1 = anon_unknown.dwarf_55d5d::ewmhSupported();
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"_NET_ACTIVE_WINDOW",&local_39);
    local_18 = getAtom(&local_38,false);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  XGetWindowAttributes(this->m_display,this->m_window,event.pad + 0x17);
  if (attr.colormap._4_4_ != 0) {
    if (local_18 == 0) {
      XRaiseWindow(this->m_display,this->m_window);
      XSetInputFocus(this->m_display,this->m_window,1,0);
      XFlush(this->m_display);
    }
    else {
      memset(&local_198,0,0xc0);
      local_198 = 0x21;
      event.xany.display = (Display *)this->m_window;
      event.xfocus.mode = 0x20;
      event.xany.window = local_18;
      event.xkey.subwindow = 1;
      event.xkey.time = this->m_lastInputTime;
      event.xselectionrequest.property = 0;
      iVar2 = XSendEvent(this->m_display,
                         *(undefined8 *)
                          (*(long *)(this->m_display + 0xe8) +
                           (long)*(int *)(this->m_display + 0xe0) * 0x80 + 0x10),0,0x180000,
                         &local_198);
      XFlush(this->m_display);
      if (iVar2 == 0) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Setting fullscreen failed, could not send \"_NET_ACTIVE_WINDOW\" event"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void WindowImplX11::grabFocus()
{
    Atom netActiveWindow = None;

    if (ewmhSupported())
        netActiveWindow = getAtom("_NET_ACTIVE_WINDOW");

    // Only try to grab focus if the window is mapped
    XWindowAttributes attr;

    XGetWindowAttributes(m_display, m_window, &attr);

    if (attr.map_state == IsUnmapped)
        return;

    if (netActiveWindow)
    {
        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netActiveWindow;
        event.xclient.data.l[0] = 1; // Normal application
        event.xclient.data.l[1] = m_lastInputTime;
        event.xclient.data.l[2] = 0; // We don't know the currently active window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        XFlush(m_display);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_ACTIVE_WINDOW\" event" << std::endl;
    }
    else
    {
        XRaiseWindow(m_display, m_window);
        XSetInputFocus(m_display, m_window, RevertToPointerRoot, CurrentTime);
        XFlush(m_display);
    }
}